

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameData.cpp
# Opt level: O2

bool __thiscall GameData::IsGameOver(GameData *this)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ofstream TempFile;
  
  uVar1 = 0;
  do {
    uVar7 = uVar1;
    if (uVar7 == 4) {
      iVar3 = this->score;
      if (this->score < this->my_best) {
        iVar3 = this->my_best;
      }
      this->my_best = iVar3;
      std::ofstream::ofstream(&TempFile,"2048GAME.data",_S_out|_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        poVar4 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_acfc);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      else {
        std::ostream::operator<<((ostream *)&TempFile,this->my_best);
      }
      std::ofstream::close();
      std::ofstream::~ofstream(&TempFile);
LAB_00102e01:
      return 3 < uVar7;
    }
    uVar6 = 0;
LAB_00102d26:
    uVar5 = (uint)uVar6;
    uVar1 = uVar7 + 1;
    if (uVar5 < 4) {
      iVar3 = this->num[uVar7][uVar6];
      if (iVar3 != 0) {
        if (uVar7 == 0) {
LAB_00102d53:
          if (this->num[uVar7 + 1][uVar6] == iVar3) goto LAB_00102e01;
        }
        else {
          if (this->num[uVar7 - 1][uVar6] == iVar3) goto LAB_00102e01;
          if (uVar7 != 3) goto LAB_00102d53;
        }
        uVar6 = 1;
        if (uVar5 == 0) goto LAB_00102d80;
        if (this->num[uVar7][uVar5 - 1] != iVar3) break;
      }
      goto LAB_00102e01;
    }
  } while( true );
  uVar6 = 4;
  if (uVar5 != 3) {
    uVar6 = (ulong)(uVar5 + 1);
LAB_00102d80:
    if (this->num[uVar7][uVar6] == iVar3) goto LAB_00102e01;
  }
  goto LAB_00102d26;
}

Assistant:

bool GameData::IsGameOver() {
    for (int i = 0; i < 4; i++) {
        for (int j = 0; j < 4; j++) {
            if (num[i][j] == 0)return false;
            if (i - 1 >= 0 && num[i - 1][j] == num[i][j])return false;
            if (i + 1 < 4 && num[i + 1][j] == num[i][j])return false;
            if (j - 1 >= 0 && num[i][j - 1] == num[i][j])return false;
            if (j + 1 < 4 && num[i][j + 1] == num[i][j])return false;
        }
    }
    my_best = std::max(my_best, score);
    std::ofstream TempFile("2048GAME.data",std::ios::out | std::ios::binary);
    if(TempFile.is_open())
        TempFile<<my_best;
    else
        std::cout<<"存储最佳分数失败！"<<std::endl;
    TempFile.close();
    return true;
}